

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall
MatroskaDemuxer::ebml_read_binary(MatroskaDemuxer *this,uint32_t *id,uint8_t **binary,int *size)

{
  uint uVar1;
  void *pvVar2;
  VodCoreException *pVVar3;
  ostream *this_00;
  string local_388;
  ostringstream local_368 [8];
  ostringstream ss_1;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream ss;
  int local_3c;
  undefined4 uStack_38;
  int res;
  int64_t rlength;
  int *size_local;
  uint8_t **binary_local;
  uint32_t *id_local;
  MatroskaDemuxer *this_local;
  
  rlength = (int64_t)size;
  size_local = (int *)binary;
  binary_local = (uint8_t **)id;
  id_local = (uint32_t *)this;
  local_3c = ebml_read_element_id(this,id,(int *)0x0);
  if ((local_3c < 0) ||
     (local_3c = ebml_read_element_length(this,(int64_t *)&uStack_38), local_3c < 0)) {
    return local_3c;
  }
  *(undefined4 *)rlength = uStack_38;
  pvVar2 = operator_new__((long)*(int *)rlength);
  *(void **)size_local = pvVar2;
  if (*(long *)size_local == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    std::operator<<((ostream *)local_1b8,"Memory allocation error");
    pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar3,0x25a,&local_1e8);
    __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  uVar1 = IOContextDemuxer::get_buffer
                    (&this->super_IOContextDemuxer,*(uint8_t **)size_local,*(uint *)rlength);
  if (uVar1 == *(uint *)rlength) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_368);
  this_00 = std::operator<<((ostream *)local_368,"Matroska parser: read error at pos ");
  std::ostream::operator<<(this_00,(this->super_IOContextDemuxer).m_processedBytes);
  pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  VodCoreException::VodCoreException(pVVar3,900,&local_388);
  __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

int MatroskaDemuxer::ebml_read_binary(uint32_t *id, uint8_t **binary, int *size)
{
    int64_t rlength;
    int res;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&rlength)) < 0)
        return res;
    *size = static_cast<int>(rlength);

    *binary = new uint8_t[*size];
    if (!(*binary))
    {
        THROW(ERR_COMMON_MEMORY, "Memory allocation error")
    }

    if (static_cast<int>(get_buffer(*binary, *size)) != *size)
    {
        THROW(ERR_MATROSKA_PARSE, "Matroska parser: read error at pos " << m_processedBytes)
    }
    return 0;
}